

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Int64ToStringMap::SerializeWithCachedSizes
          (Int64ToStringMap *this,CodedOutputStream *output)

{
  MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *key;
  undefined1 auVar1 [16];
  bool bVar2;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar3;
  size_type sVar4;
  ulong uVar5;
  SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *pSVar6;
  SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *pSVar7;
  const_pointer key_00;
  const_pointer pvVar8;
  EntryType *pEVar9;
  MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar10;
  const_reference pvVar11;
  SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *local_f8;
  const_iterator local_d0;
  undefined1 local_b8 [8];
  const_iterator it_1;
  scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
  entry_1;
  size_type i;
  scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
  entry;
  SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_80;
  const_iterator local_70;
  undefined1 local_58 [8];
  const_iterator it;
  size_type n;
  scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  local_28;
  scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  items;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Int64ToStringMap *this_local;
  
  items.array_._4_4_ = 0;
  pMVar3 = map_abi_cxx11_(this);
  bVar2 = google::protobuf::
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty(pMVar3);
  if (!bVar2) {
    bVar2 = google::protobuf::io::CodedOutputStream::IsSerializationDeterministic(output);
    if (bVar2) {
      pMVar3 = map_abi_cxx11_(this);
      sVar4 = google::protobuf::
              Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(pMVar3);
      if (1 < sVar4) {
        pMVar3 = map_abi_cxx11_(this);
        sVar4 = google::protobuf::
                Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size(pMVar3);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar4;
        uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
        if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        pSVar6 = (SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                  *)operator_new__(uVar5);
        if (sVar4 != 0) {
          local_f8 = pSVar6;
          do {
            google::protobuf::internal::
            SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
            ::SortItem(local_f8);
            local_f8 = local_f8 + 1;
          } while (local_f8 != pSVar6 + sVar4);
        }
        google::protobuf::internal::
        scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
        ::scoped_array(&local_28,pSVar6);
        it.it_.bucket_index_ = 0;
        pMVar3 = map_abi_cxx11_(this);
        google::protobuf::
        Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::begin((const_iterator *)local_58,pMVar3);
        while( true ) {
          pMVar3 = map_abi_cxx11_(this);
          google::protobuf::
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::end(&local_70,pMVar3);
          bVar2 = google::protobuf::operator!=((const_iterator *)local_58,&local_70);
          if (!bVar2) break;
          pvVar11 = google::protobuf::
                    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::const_iterator::operator*((const_iterator *)local_58);
          google::protobuf::internal::
          SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
          ::SortItem(&local_80,pvVar11);
          pSVar6 = google::protobuf::internal::
                   scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                   ::operator[](&local_28,it.it_.bucket_index_);
          pSVar6->first = local_80.first;
          pSVar6->second = local_80.second;
          google::protobuf::
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator++((const_iterator *)local_58);
          it.it_.bucket_index_ = it.it_.bucket_index_ + 1;
        }
        pSVar6 = google::protobuf::internal::
                 scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                 ::operator[](&local_28,0);
        pSVar7 = google::protobuf::internal::
                 scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                 ::operator[](&local_28,it.it_.bucket_index_);
        std::
        sort<google::protobuf::internal::SortItem<long,google::protobuf::MapPair<long,std::__cxx11::string>const*>*,google::protobuf::internal::CompareByFirstField<google::protobuf::internal::SortItem<long,google::protobuf::MapPair<long,std::__cxx11::string>const*>>>
                  (pSVar6,pSVar7);
        google::protobuf::internal::
        scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
        ::scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                      *)&i,(MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                            *)0x0);
        for (entry_1.ptr_ = (MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                             *)0x0; entry_1.ptr_ < it.it_.bucket_index_;
            entry_1.ptr_ = (MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                            *)((long)&((entry_1.ptr_)->
                                      super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                                      ).super_MessageLite._vptr_MessageLite + 1)) {
          pSVar6 = google::protobuf::internal::
                   scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                   ::operator[](&local_28,(ptrdiff_t)entry_1.ptr_);
          key = pSVar6->second;
          pSVar6 = google::protobuf::internal::
                   scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                   ::operator[](&local_28,(ptrdiff_t)entry_1.ptr_);
          pEVar9 = google::protobuf::internal::
                   MapFieldLite<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                   ::NewEntryWrapper(&this->map_,&key->first,&pSVar6->second->second);
          google::protobuf::internal::
          scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
          ::reset((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                   *)&i,pEVar9);
          pMVar10 = google::protobuf::internal::
                    scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                    ::operator*((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                                 *)&i);
          google::protobuf::internal::WireFormatLite::WriteMessage(1,(MessageLite *)pMVar10,output);
          pSVar6 = google::protobuf::internal::
                   scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                   ::operator[](&local_28,(ptrdiff_t)entry_1.ptr_);
          SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__
                    (pSVar6->second);
        }
        google::protobuf::internal::
        scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
        ::~scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                       *)&i);
        google::protobuf::internal::
        scoped_array<google::protobuf::internal::SortItem<long,_const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
        ::~scoped_array(&local_28);
        return;
      }
    }
    google::protobuf::internal::
    scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
    ::scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                  *)&it_1.it_.bucket_index_,
                 (MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                  *)0x0);
    pMVar3 = map_abi_cxx11_(this);
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    begin((const_iterator *)local_b8,pMVar3);
    while( true ) {
      pMVar3 = map_abi_cxx11_(this);
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      end(&local_d0,pMVar3);
      bVar2 = google::protobuf::operator!=((const_iterator *)local_b8,&local_d0);
      if (!bVar2) break;
      key_00 = google::protobuf::
               Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::const_iterator::operator->((const_iterator *)local_b8);
      pvVar8 = google::protobuf::
               Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::const_iterator::operator->((const_iterator *)local_b8);
      pEVar9 = google::protobuf::internal::
               MapFieldLite<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
               ::NewEntryWrapper(&this->map_,&key_00->first,&pvVar8->second);
      google::protobuf::internal::
      scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
      ::reset((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
               *)&it_1.it_.bucket_index_,pEVar9);
      pMVar10 = google::protobuf::internal::
                scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                ::operator*((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                             *)&it_1.it_.bucket_index_);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,(MessageLite *)pMVar10,output);
      pvVar11 = google::protobuf::
                Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::const_iterator::operator*((const_iterator *)local_b8);
      SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__(pvVar11);
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      const_iterator::operator++((const_iterator *)local_b8);
    }
    google::protobuf::internal::
    scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
    ::~scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                   *)&it_1.it_.bucket_index_);
  }
  return;
}

Assistant:

void Int64ToStringMap::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Int64ToStringMap)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // map<int64, string> map = 1;
  if (!this->map().empty()) {
    typedef ::google::protobuf::Map< ::google::protobuf::int64, ::std::string >::const_pointer
        ConstPtr;
    typedef ::google::protobuf::internal::SortItem< ::google::protobuf::int64, ConstPtr > SortItem;
    typedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), p->second.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Int64ToStringMap.MapEntry.value");
      }
    };

    if (output->IsSerializationDeterministic() &&
        this->map().size() > 1) {
      ::google::protobuf::scoped_array<SortItem> items(
          new SortItem[this->map().size()]);
      typedef ::google::protobuf::Map< ::google::protobuf::int64, ::std::string >::size_type size_type;
      size_type n = 0;
      for (::google::protobuf::Map< ::google::protobuf::int64, ::std::string >::const_iterator
          it = this->map().begin();
          it != this->map().end(); ++it, ++n) {
        items[n] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[n], Less());
      ::google::protobuf::scoped_ptr<Int64ToStringMap_MapEntry> entry;
      for (size_type i = 0; i < n; i++) {
        entry.reset(map_.NewEntryWrapper(
            items[i].second->first, items[i].second->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            1, *entry, output);
        Utf8Check::Check(items[i].second);
      }
    } else {
      ::google::protobuf::scoped_ptr<Int64ToStringMap_MapEntry> entry;
      for (::google::protobuf::Map< ::google::protobuf::int64, ::std::string >::const_iterator
          it = this->map().begin();
          it != this->map().end(); ++it) {
        entry.reset(map_.NewEntryWrapper(
            it->first, it->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            1, *entry, output);
        Utf8Check::Check(&*it);
      }
    }
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Int64ToStringMap)
}